

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

bool __thiscall
wasm::analysis::Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_>::join
          (Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_> *this,Element *joinee,
          Element *joiner)

{
  __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
  __first;
  bool bVar1;
  ulong uVar2;
  const_iterator __position;
  __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
  __tmp_1;
  pointer joiner_00;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __tmp;
  Type *joinee_00;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  __first._M_current =
       (joiner->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
       super__Vector_impl_data._M_start;
  joiner_00 = (joiner->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  uVar3 = (long)joiner_00 - (long)__first._M_current >> 3;
  __position._M_current =
       (joinee->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
       super__Vector_impl_data._M_start;
  joinee_00 = (joinee->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  uVar2 = (long)joinee_00 - (long)__position._M_current >> 3;
  lVar4 = uVar3 - uVar2;
  bVar5 = uVar3 >= uVar2 && lVar4 != 0;
  if (uVar3 < uVar2 || lVar4 == 0) {
    lVar4 = 0;
  }
  else {
    std::vector<wasm::Type,std::allocator<wasm::Type>>::
    insert<__gnu_cxx::__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,void>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)joinee,__position,__first,
               __first._M_current + lVar4);
    __position._M_current =
         (joinee->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
         super__Vector_impl_data._M_start;
    joinee_00 = (joinee->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    joiner_00 = (joiner->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish;
  }
  while ((joinee_00 != __position._M_current + lVar4 &&
         (joiner_00 !=
          (joiner->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
          super__Vector_impl_data._M_start))) {
    joinee_00 = joinee_00 + -1;
    joiner_00 = joiner_00 + -1;
    bVar1 = Inverted<wasm::analysis::ValType>::join<wasm::Type>
                      ((Inverted<wasm::analysis::ValType> *)this,joinee_00,joiner_00);
    bVar5 = (bool)(bVar5 | bVar1);
  }
  return bVar5;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    // If joiner is deeper than joinee, prepend those extra elements to joinee
    // first. They don't need to be explicitly joined with anything because they
    // would be joined with bottom, which wouldn't change them.
    bool result = false;
    size_t extraSize = 0;
    if (joiner.size() > joinee.size()) {
      extraSize = joiner.size() - joinee.size();
      auto extraBegin = joiner.begin();
      auto extraEnd = joiner.begin() + extraSize;
      joinee.insert(joinee.begin(), extraBegin, extraEnd);
      result = true;
    }
    // Join all the elements present in both materialized stacks, starting from
    // the end so the stack tops match up. Stop the iteration when we've
    // processed all of joinee, excluding any extra elements from joiner we just
    // prepended to it, or when we've processed all of joiner.
    auto joineeIt = joinee.rbegin();
    auto joinerIt = joiner.rbegin();
    auto joineeEnd = joinee.rend() - extraSize;
    for (; joineeIt != joineeEnd && joinerIt != joiner.rend();
         ++joineeIt, ++joinerIt) {
      result |= lattice.join(*joineeIt, *joinerIt);
    }
    return result;
  }